

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImGuiContext *pIVar1;
  ImGuiPopupData *__src;
  byte in_SIL;
  uint in_EDI;
  ImGuiWindow *focus_window;
  ImGuiWindow *popup_window;
  ImGuiPopupData prev_popup;
  ImGuiContext *g;
  int in_stack_ffffffffffffff9c;
  ImVector<ImGuiPopupData> *in_stack_ffffffffffffffa0;
  ImGuiWindow *pIVar2;
  undefined1 local_48 [4];
  ImGuiFocusRequestFlags in_stack_ffffffffffffffbc;
  ImGuiViewport *in_stack_ffffffffffffffc0;
  ImGuiWindow *in_stack_ffffffffffffffc8;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  ImGuiFocusRequestFlags in_stack_ffffffffffffffdc;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  
  pIVar1 = GImGui;
  if ((GImGui->DebugLogFlags & 4U) != 0) {
    DebugLog("[popup] ClosePopupToLevel(%d), restore_under=%d\n",(ulong)in_EDI,(ulong)(in_SIL & 1));
  }
  __src = ImVector<ImGuiPopupData>::operator[](&pIVar1->OpenPopupStack,in_EDI);
  memcpy(local_48,__src,0x38);
  ImVector<ImGuiPopupData>::resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  if (((in_SIL & 1) != 0) && (in_stack_ffffffffffffffc0 != (ImGuiViewport *)0x0)) {
    pIVar2 = in_stack_ffffffffffffffc8;
    if (((uint)(in_stack_ffffffffffffffc0->Size).y & 0x10000000) != 0) {
      pIVar2 = *(ImGuiWindow **)(in_stack_ffffffffffffffc0 + 0x10);
    }
    if ((pIVar2 == (ImGuiWindow *)0x0) || ((pIVar2->WasActive & 1U) != 0)) {
      FocusWindow(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
    else {
      FocusTopMostWindowUnderOne
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffbc);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupToLevel(%d), restore_under=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiPopupData prev_popup = g.OpenPopupStack[remaining];
    g.OpenPopupStack.resize(remaining);

    // Restore focus (unless popup window was not yet submitted, and didn't have a chance to take focus anyhow. See #7325 for an edge case)
    if (restore_focus_to_window_under_popup && prev_popup.Window)
    {
        ImGuiWindow* popup_window = prev_popup.Window;
        ImGuiWindow* focus_window = (popup_window->Flags & ImGuiWindowFlags_ChildMenu) ? popup_window->ParentWindow : prev_popup.RestoreNavWindow;
        if (focus_window && !focus_window->WasActive)
            FocusTopMostWindowUnderOne(popup_window, NULL, NULL, ImGuiFocusRequestFlags_RestoreFocusedChild); // Fallback
        else
            FocusWindow(focus_window, (g.NavLayer == ImGuiNavLayer_Main) ? ImGuiFocusRequestFlags_RestoreFocusedChild : ImGuiFocusRequestFlags_None);
    }
}